

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O3

void __thiscall CHIP8::initialise(CHIP8 *this)

{
  long lVar1;
  time_t tVar2;
  
  this->opcode = 0;
  this->I = 0;
  this->pc = 0x200;
  this->sp = 0;
  this->delayTimer = '\0';
  this->soundTimer = '\0';
  this->key[0] = '\0';
  this->key[1] = '\0';
  this->key[2] = '\0';
  this->key[3] = '\0';
  this->key[4] = '\0';
  this->key[5] = '\0';
  this->key[6] = '\0';
  this->key[7] = '\0';
  this->key[8] = '\0';
  this->key[9] = '\0';
  this->key[10] = '\0';
  this->key[0xb] = '\0';
  this->key[0xc] = '\0';
  this->key[0xd] = '\0';
  this->key[0xe] = '\0';
  this->key[0xf] = '\0';
  lVar1 = 0x83a;
  do {
    *(undefined2 *)((long)this + lVar1 * 2 + -0x85c) = 0;
    this->graphics[lVar1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x84a);
  memset(this,0,0x800);
  memset(this->memory + 0x50,0,0xfb0);
  memcpy(this->memory,CHIP8Fontset,0x50);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  return;
}

Assistant:

void CHIP8::initialise(){

    opcode     = 0;
    I          = 0;
    pc         = 0x200;
    sp         = 0;
    delayTimer = 0;
    soundTimer = 0;

    for (int i = 0; i < 16; ++i){
        stack[i] = 0;
        R[i]     = 0;
        key[i]   = 0;
    }

    for (int i = 0; i < 64 * 32; ++i){
        graphics[i] = 0;
    }

    for (int i = 0; i < 4096; ++i){
        memory[i] = 0;
    }

    for (int i = 0; i < 80; ++i){
        memory[i] = CHIP8Fontset[i];
    }

    srand(time(0));
}